

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

string * __thiscall
wabt::Decompiler::OpcodeToToken_abi_cxx11_
          (string *__return_storage_ptr__,Decompiler *this,Opcode opcode)

{
  char *pcVar1;
  char local_3a [2];
  char *local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  allocator local_22;
  undefined1 local_21;
  Decompiler *local_20;
  Decompiler *this_local;
  string *psStack_10;
  Opcode opcode_local;
  string *s;
  
  local_21 = 0;
  local_20 = this;
  this_local._4_4_ = opcode.enum_;
  psStack_10 = __return_storage_ptr__;
  pcVar1 = Opcode::GetDecomp((Opcode *)((long)&this_local + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  local_30._M_current = (char *)std::__cxx11::string::begin();
  local_38 = (char *)std::__cxx11::string::end();
  local_3a[1] = 0x2e;
  local_3a[0] = '_';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_30,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_38,local_3a + 1,local_3a);
  return __return_storage_ptr__;
}

Assistant:

std::string OpcodeToToken(Opcode opcode) {
    std::string s = opcode.GetDecomp();
    std::replace(s.begin(), s.end(), '.', '_');
    return s;
  }